

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O0

int __thiscall QFile::copy(QFile *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  FileError FVar2;
  int iVar3;
  QFilePrivate *this_00;
  EVP_PKEY_CTX *src_00;
  long in_FS_OFFSET;
  QFilePrivate *d;
  undefined4 in_stack_ffffffffffffff48;
  FileError in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  QMessageLogger *in_stack_ffffffffffffff60;
  byte local_59;
  QMessageLogger local_40;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFile *)0x2a5a55);
  (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x1d])(local_20);
  bVar1 = QString::isEmpty((QString *)0x2a5a7d);
  QString::~QString((QString *)0x2a5a8e);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff60,
               (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff54,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QMessageLogger::warning(&local_40,"QFile::copy: Empty or null file name");
    local_59 = 0;
  }
  else {
    bVar1 = exists((QString *)0x2a5ad2);
    if (bVar1) {
      tr((char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
         (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
         in_stack_ffffffffffffff4c);
      QFileDevicePrivate::setError
                ((QFileDevicePrivate *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                 ,in_stack_ffffffffffffff4c,(QString *)0x2a5b15);
      QString::~QString((QString *)0x2a5b21);
      local_59 = 0;
    }
    else {
      QFileDevice::unsetError
                ((QFileDevice *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])();
      FVar2 = QFileDevice::error((QFileDevice *)
                                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      if (FVar2 == NoError) {
        iVar3 = QFilePrivate::copy(this_00,dst,src_00);
        local_59 = (byte)iVar3 & 1;
      }
      else {
        local_59 = 0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_59);
  }
  __stack_chk_fail();
}

Assistant:

bool
QFile::copy(const QString &newName)
{
    Q_D(QFile);
    if (fileName().isEmpty()) {
        qWarning("QFile::copy: Empty or null file name");
        return false;
    }
    if (QFile::exists(newName)) {
        // ### Race condition. If a file is moved in after this, it /will/ be
        // overwritten. On Unix, the proper solution is to use hardlinks:
        // return ::link(old, new) && ::remove(old); See also rename().
        d->setError(QFile::CopyError, tr("Destination file exists"));
        return false;
    }
    unsetError();
    close();
    if (error() == QFile::NoError)
        return d->copy(newName);
    return false;
}